

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_ab3350::RateRepresentationPredicate::Rate
          (RateRepresentationPredicate *this,IfcRepresentation *r)

{
  Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem> *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  IfcRepresentationItem *pIVar2;
  IfcMappedItem *pIVar3;
  IfcRepresentationMap *pIVar4;
  
  while( true ) {
    if (((IfcRepresentation *)this)->field_0x38 != '\x01') {
      return 0;
    }
    __lhs = Assimp::STEP::
            Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&(((IfcRepresentation *)this)->
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                      field_0x18);
    bVar1 = std::operator==(__lhs,"MappedRepresentation");
    if (!bVar1) break;
    this_00 = (((IfcRepresentation *)this)->Items).
              super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
              .
              super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (this_00 ==
        (((IfcRepresentation *)this)->Items).
        super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
        .
        super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return 100;
    }
    pIVar2 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>::operator->(this_00)
    ;
    pIVar3 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcMappedItem>
                       ((Object *)
                        ((long)&(pIVar2->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                )._vptr_ObjectHelper +
                        (long)(pIVar2->
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              )._vptr_ObjectHelper[-3]));
    if (pIVar3 == (IfcMappedItem *)0x0) {
      return 100;
    }
    pIVar4 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>::operator->
                       ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap> *)
                        &(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).
                         field_0x10);
    this = (RateRepresentationPredicate *)
           Assimp::STEP::Lazy::operator_cast_to_IfcRepresentation_
                     ((Lazy *)&(pIVar4->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                               ).field_0x20);
  }
  bVar1 = std::operator==(__lhs,"SolidModel");
  if (bVar1) {
    return -3;
  }
  bVar1 = std::operator==(__lhs,"SweptSolid");
  if (bVar1) {
    return -10;
  }
  bVar1 = std::operator==(__lhs,"Clipping");
  if (bVar1) {
    return -5;
  }
  bVar1 = std::operator==(__lhs,"Brep");
  if (bVar1) {
    return -2;
  }
  bVar1 = std::operator==(__lhs,"BoundingBox");
  if (bVar1) {
    return 100;
  }
  bVar1 = std::operator==(__lhs,"Curve2D");
  if (bVar1) {
    return 100;
  }
  return 0;
}

Assistant:

int Rate(const Schema_2x3::IfcRepresentation* r) const {
        // the smaller, the better

        if (! r->RepresentationIdentifier) {
            // neutral choice if no extra information is specified
            return 0;
        }


        const std::string& name = r->RepresentationIdentifier.Get();
        if (name == "MappedRepresentation") {
            if (!r->Items.empty()) {
                // take the first item and base our choice on it
                const Schema_2x3::IfcMappedItem* const m = r->Items.front()->ToPtr<Schema_2x3::IfcMappedItem>();
                if (m) {
                    return Rate(m->MappingSource->MappedRepresentation);
                }
            }
            return 100;
        }

        return Rate(name);
    }